

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

bool __thiscall
File::writeMechanismTypeSet
          (File *this,
          set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *value)

{
  bool bVar1;
  _Rb_tree_const_iterator<unsigned_long> *in_RDI;
  const_iterator i;
  unsigned_long in_stack_00000030;
  File *in_stack_00000038;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_ffffffffffffffc8;
  _Self local_28;
  _Self local_20 [3];
  bool local_1;
  
  if (((ulong)in_RDI[5]._M_node & 1) == 0) {
    local_1 = false;
  }
  else {
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::size
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               0x1d1b72);
    bVar1 = writeULong(in_stack_00000038,in_stack_00000030);
    if (bVar1) {
      local_20[0]._M_node =
           (_Base_ptr)
           std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::begin
                     (in_stack_ffffffffffffffc8);
      while( true ) {
        local_28._M_node =
             (_Base_ptr)
             std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                       (in_stack_ffffffffffffffc8);
        bVar1 = std::operator!=(local_20,&local_28);
        if (!bVar1) break;
        std::_Rb_tree_const_iterator<unsigned_long>::operator*(in_RDI);
        bVar1 = writeULong(in_stack_00000038,in_stack_00000030);
        if (!bVar1) {
          return false;
        }
        std::_Rb_tree_const_iterator<unsigned_long>::operator++(in_RDI);
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool File::writeMechanismTypeSet(const std::set<CK_MECHANISM_TYPE>& value)
{
	if (!valid) return false;

	// write length
	if (!writeULong(value.size()))
	{
		return false;
	}

	// write each value
	for (std::set<CK_MECHANISM_TYPE>::const_iterator i = value.begin(); i != value.end(); ++i)
	{
		if (!writeULong(*i)) return false;
	}

	return true;
}